

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

size_t quicly_send_retry(quicly_context_t *ctx,ptls_aead_context_t *token_encrypt_ctx,
                        uint32_t protocol_version,sockaddr *dest_addr,ptls_iovec_t dest_cid,
                        sockaddr *src_addr,ptls_iovec_t src_cid,ptls_iovec_t odcid,
                        ptls_iovec_t token_prefix,ptls_iovec_t appdata,
                        ptls_aead_context_t **retry_aead_cache,uint8_t *datagram)

{
  long lVar1;
  size_t sVar2;
  quicly_context_t *pqVar3;
  int iVar4;
  ptls_aead_context_t *ctx_00;
  size_t sVar5;
  ptls_buffer_t local_2d0;
  quicly_context_t *local_2b0;
  undefined1 local_2a4;
  undefined1 local_2a3;
  undefined1 local_2a2;
  undefined1 local_2a1;
  uint8_t *local_2a0;
  size_t local_298;
  ptls_aead_context_t *local_290;
  quicly_address_token_plaintext_t local_288;
  
  local_298 = dest_cid.len;
  local_2a0 = dest_cid.base;
  local_290 = token_encrypt_ctx;
  if ((src_cid.len == odcid.len) && (iVar4 = bcmp(src_cid.base,odcid.base,src_cid.len), iVar4 == 0))
  {
    __assert_fail("!(src_cid.len == odcid.len && memcmp(src_cid.base, odcid.base, src_cid.len) == 0)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                  ,0xf1f,
                  "size_t quicly_send_retry(quicly_context_t *, ptls_aead_context_t *, uint32_t, struct sockaddr *, ptls_iovec_t, struct sockaddr *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_aead_context_t **, uint8_t *)"
                 );
  }
  local_2b0 = ctx;
  local_288.issued_at = (*ctx->now->cb)(ctx->now);
  local_288.type = QUICLY_ADDRESS_TOKEN_TYPE_RETRY;
  local_288._4_4_ = 0;
  memset(&local_288.local,0,0x248);
  set_address(&local_288.remote,dest_addr);
  set_address(&local_288.local,src_addr);
  memcpy(&local_288.field_4,odcid.base,odcid.len);
  sVar5 = local_298;
  local_288.field_4.retry.original_dcid.len = odcid.len._0_1_;
  memcpy((void *)((long)&local_288.field_4 + 0x15),local_2a0,local_298);
  local_288.field_4.retry.client_cid.len = (uint8_t)sVar5;
  memcpy((void *)((long)&local_288.field_4 + 0x2a),src_cid.base,src_cid.len);
  local_288.field_4.retry.server_cid.len = src_cid.len._0_1_;
  if (appdata.len != 0) {
    if (0x100 < appdata.len) {
      __assert_fail("appdata.len <= sizeof(token.appdata.bytes)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0xf2a,
                    "size_t quicly_send_retry(quicly_context_t *, ptls_aead_context_t *, uint32_t, struct sockaddr *, ptls_iovec_t, struct sockaddr *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_aead_context_t **, uint8_t *)"
                   );
    }
    memcpy(&local_288.appdata,appdata.base,appdata.len);
    local_288.appdata.len = appdata.len;
  }
  ptls_buffer_init(&local_2d0,datagram,0x4b0);
  iVar4 = ptls_buffer__do_pushv(&local_2d0,"",1);
  sVar2 = local_2d0.off;
  sVar5 = 0xffffffffffffffff;
  if ((iVar4 == 0) && (iVar4 = ptls_buffer__do_pushv(&local_2d0,odcid.base,odcid.len), iVar4 == 0))
  {
    local_2d0.base[sVar2 - 1] = (char)local_2d0.off - (char)sVar2;
    (*local_2b0->tls->random_bytes)(local_2d0.base + local_2d0.off,1);
    local_2d0.base[local_2d0.off] = local_2d0.base[local_2d0.off] | 0xf0;
    local_2d0.off = local_2d0.off + 1;
    local_2a4 = (undefined1)(protocol_version >> 0x18);
    local_2a3 = (undefined1)(protocol_version >> 0x10);
    local_2a2 = (undefined1)(protocol_version >> 8);
    local_2a1 = (undefined1)protocol_version;
    iVar4 = ptls_buffer__do_pushv(&local_2d0,&local_2a4,4);
    if ((iVar4 == 0) &&
       ((iVar4 = ptls_buffer__do_pushv(&local_2d0,"",1), sVar2 = local_2d0.off, iVar4 == 0 &&
        (iVar4 = ptls_buffer__do_pushv(&local_2d0,local_2a0,local_298), iVar4 == 0)))) {
      local_2d0.base[sVar2 - 1] = (char)local_2d0.off - (char)sVar2;
      iVar4 = ptls_buffer__do_pushv(&local_2d0,"",1);
      sVar2 = local_2d0.off;
      if ((iVar4 == 0) &&
         (iVar4 = ptls_buffer__do_pushv(&local_2d0,src_cid.base,src_cid.len), pqVar3 = local_2b0,
         iVar4 == 0)) {
        local_2d0.base[sVar2 - 1] = (char)local_2d0.off - (char)sVar2;
        if (token_prefix.len != 0) {
          if (local_2d0.capacity - local_2d0.off < token_prefix.len) {
            __assert_fail("token_prefix.len <= buf.capacity - buf.off",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                          ,0xf3b,
                          "size_t quicly_send_retry(quicly_context_t *, ptls_aead_context_t *, uint32_t, struct sockaddr *, ptls_iovec_t, struct sockaddr *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_aead_context_t **, uint8_t *)"
                         );
          }
          memcpy(local_2d0.base + local_2d0.off,token_prefix.base,token_prefix.len);
          local_2d0.off = local_2d0.off + token_prefix.len;
        }
        iVar4 = quicly_encrypt_address_token
                          (pqVar3->tls->random_bytes,local_290,&local_2d0,
                           local_2d0.off - token_prefix.len,&local_288);
        if (iVar4 == 0) {
          iVar4 = ptls_buffer_reserve(&local_2d0,0x10);
          if (iVar4 != 0) {
            __assert_fail("ret == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                          ,0xf45,
                          "size_t quicly_send_retry(quicly_context_t *, ptls_aead_context_t *, uint32_t, struct sockaddr *, ptls_iovec_t, struct sockaddr *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_aead_context_t **, uint8_t *)"
                         );
          }
          if (local_2d0.is_allocated != 0) {
            __assert_fail("!buf.is_allocated && \"retry packet is too large\"",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                          ,0xf46,
                          "size_t quicly_send_retry(quicly_context_t *, ptls_aead_context_t *, uint32_t, struct sockaddr *, ptls_iovec_t, struct sockaddr *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, ptls_aead_context_t **, uint8_t *)"
                         );
          }
          if ((retry_aead_cache == (ptls_aead_context_t **)0x0) ||
             (ctx_00 = *retry_aead_cache, ctx_00 == (ptls_aead_context_t *)0x0)) {
            ctx_00 = create_retry_aead(local_2b0,protocol_version,1);
          }
          (*ctx_00->do_encrypt)
                    (ctx_00,local_2d0.base + local_2d0.off,"",0,0,local_2d0.base,local_2d0.off,
                     (ptls_aead_supplementary_encryption_t *)0x0);
          if (retry_aead_cache == (ptls_aead_context_t **)0x0) {
            ptls_aead_free(ctx_00);
          }
          else {
            *retry_aead_cache = ctx_00;
          }
          lVar1 = local_2d0.off + ~odcid.len;
          local_2d0.off = local_2d0.off + 0x10;
          memmove(local_2d0.base,local_2d0.base + odcid.len + 1,lVar1 + 0x10);
          sVar5 = ~odcid.len + local_2d0.off;
        }
      }
    }
  }
  return sVar5;
}

Assistant:

size_t quicly_send_retry(quicly_context_t *ctx, ptls_aead_context_t *token_encrypt_ctx, uint32_t protocol_version,
                         struct sockaddr *dest_addr, ptls_iovec_t dest_cid, struct sockaddr *src_addr, ptls_iovec_t src_cid,
                         ptls_iovec_t odcid, ptls_iovec_t token_prefix, ptls_iovec_t appdata,
                         ptls_aead_context_t **retry_aead_cache, uint8_t *datagram)
{
    quicly_address_token_plaintext_t token;
    ptls_buffer_t buf;
    int ret;

    assert(!(src_cid.len == odcid.len && memcmp(src_cid.base, odcid.base, src_cid.len) == 0));

    /* build token as plaintext */
    token = (quicly_address_token_plaintext_t){QUICLY_ADDRESS_TOKEN_TYPE_RETRY, ctx->now->cb(ctx->now)};
    set_address(&token.remote, dest_addr);
    set_address(&token.local, src_addr);

    quicly_set_cid(&token.retry.original_dcid, odcid);
    quicly_set_cid(&token.retry.client_cid, dest_cid);
    quicly_set_cid(&token.retry.server_cid, src_cid);
    if (appdata.len != 0) {
        assert(appdata.len <= sizeof(token.appdata.bytes));
        memcpy(token.appdata.bytes, appdata.base, appdata.len);
        token.appdata.len = appdata.len;
    }

    /* start building the packet */
    ptls_buffer_init(&buf, datagram, QUICLY_MIN_CLIENT_INITIAL_SIZE);

    /* first generate a pseudo packet */
    ptls_buffer_push_block(&buf, 1, { ptls_buffer_pushv(&buf, odcid.base, odcid.len); });
    ctx->tls->random_bytes(buf.base + buf.off, 1);
    buf.base[buf.off] = QUICLY_PACKET_TYPE_RETRY | (buf.base[buf.off] & 0x0f);
    ++buf.off;
    ptls_buffer_push32(&buf, protocol_version);
    ptls_buffer_push_block(&buf, 1, { ptls_buffer_pushv(&buf, dest_cid.base, dest_cid.len); });
    ptls_buffer_push_block(&buf, 1, { ptls_buffer_pushv(&buf, src_cid.base, src_cid.len); });
    if (token_prefix.len != 0) {
        assert(token_prefix.len <= buf.capacity - buf.off);
        memcpy(buf.base + buf.off, token_prefix.base, token_prefix.len);
        buf.off += token_prefix.len;
    }
    if ((ret = quicly_encrypt_address_token(ctx->tls->random_bytes, token_encrypt_ctx, &buf, buf.off - token_prefix.len, &token)) !=
        0)
        goto Exit;

    /* append AEAD tag */
    ret = ptls_buffer_reserve(&buf, PTLS_AESGCM_TAG_SIZE);
    assert(ret == 0);
    assert(!buf.is_allocated && "retry packet is too large");
    {
        ptls_aead_context_t *aead =
            retry_aead_cache != NULL && *retry_aead_cache != NULL ? *retry_aead_cache : create_retry_aead(ctx, protocol_version, 1);
        ptls_aead_encrypt(aead, buf.base + buf.off, "", 0, 0, buf.base, buf.off);
        if (retry_aead_cache != NULL) {
            *retry_aead_cache = aead;
        } else {
            ptls_aead_free(aead);
        }
    }
    buf.off += PTLS_AESGCM_TAG_SIZE;

    /* convert the image to a Retry packet, by stripping the ODCID field */
    memmove(buf.base, buf.base + odcid.len + 1, buf.off - (odcid.len + 1));
    buf.off -= odcid.len + 1;

    ret = 0;

Exit:
    return ret == 0 ? buf.off : SIZE_MAX;
}